

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

void find_and_set_sub_lines
               (Am_Value *target_value,Am_Object *group,Am_Object *not_part,Am_Value_List *ret_list)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object part;
  Am_Value_List parts;
  Am_Object local_58;
  Am_Value_List *local_50;
  Am_Object local_48;
  Am_Value_List local_40;
  
  local_50 = ret_list;
  pAVar2 = Am_Object::Get(group,0x82,0);
  Am_Value_List::Am_Value_List(&local_40,pAVar2);
  local_58.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&local_40);
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_40);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&local_40);
    Am_Object::operator=(&local_58,pAVar2);
    bVar1 = Am_Object::operator!=(&local_58,not_part);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&local_58,0x169,0);
      bVar1 = Am_Value_List::List_Or_Value_Equal(pAVar2,target_value);
      if (bVar1) {
        value = Am_Object::operator_cast_to_Am_Wrapper_(&local_58);
        Am_Value_List::Add(local_50,value,Am_TAIL,true);
        set_text_leaf_parts(&local_58,&Am_Yellow);
      }
      else {
        Am_Object::Am_Object(&local_48,&Am_Group);
        bVar1 = Am_Object::Is_Instance_Of(&local_58,&local_48);
        Am_Object::~Am_Object(&local_48);
        if (bVar1) {
          find_and_set_sub_lines(target_value,&local_58,not_part,local_50);
        }
      }
    }
    Am_Value_List::Next(&local_40);
  }
  Am_Object::~Am_Object(&local_58);
  Am_Value_List::~Am_Value_List(&local_40);
  return;
}

Assistant:

void
find_and_set_sub_lines(Am_Value &target_value, Am_Object &group,
                       Am_Object &not_part, Am_Value_List &ret_list)
{
  Am_Value_List parts = group.Get(Am_GRAPHICAL_PARTS);
  Am_Object part;
  for (parts.Start(); !parts.Last(); parts.Next()) {
    part = parts.Get();
    if (part != not_part) {
      if (Am_Value_List::List_Or_Value_Equal(part.Get(Am_VALUE),
                                             target_value)) {
        ret_list.Add(part);
        set_text_leaf_parts(part, Am_Yellow);
      } else if (part.Is_Instance_Of(Am_Group))
        find_and_set_sub_lines(target_value, part, not_part, ret_list);
    }
  }
}